

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

bool DoArbitrate(void *userdata)

{
  FStartupScreen *pFVar1;
  bool bVar2;
  char *pcVar3;
  byte bVar4;
  uint local_44;
  int local_40;
  int local_3c;
  int j;
  int i;
  int node;
  int version;
  BYTE *stream;
  char *s;
  ArbitrateData *data;
  void *userdata_local;
  
  s = (char *)userdata;
  data = (ArbitrateData *)userdata;
LAB_00599a74:
  bVar2 = HGetPacket();
  if (bVar2) {
    if (doomcom.data[0] == 0x80) {
      I_FatalError("The game was aborted.");
    }
    if (doomcom.remotenode == 0) goto LAB_00599a74;
    if ((doomcom.data[0] == ' ') || (doomcom.data[0] == '!')) {
      if (doomcom.data[0] == ' ') {
        local_44 = (uint)doomcom.remotenode;
      }
      else {
        local_44 = nodeforplayer[doomcom.data[1]];
      }
      *(uint *)(s + (long)(int)local_44 * 4) =
           (uint)doomcom.data[5] << 0x18 | (uint)doomcom.data[6] << 0x10 |
           (uint)doomcom.data[7] << 8 | (uint)doomcom.data[8];
      if (doomcom.data[0] == ' ') {
        s[(long)(int)local_44 + 0x20] = doomcom.data[9] & 0x80;
        _node = doomcom.data + 10;
      }
      else {
        _node = doomcom.data + 9;
      }
      D_ReadUserInfoStrings((uint)doomcom.data[1],(BYTE **)&node,false);
      if ((nodeingame[(int)local_44] & 1U) == 0) {
        if (((uint)doomcom.data[2] << 0x10 | (uint)doomcom.data[3] << 8 | (uint)doomcom.data[4]) !=
            0xff00e8) {
          I_Error("Different GZDoom versions cannot play a net game");
        }
        playeringame[doomcom.data[1]] = true;
        nodeingame[(int)local_44] = true;
        *(uint *)s = 1 << (doomcom.data[1] & 0x1f) | *(uint *)s;
        pFVar1 = StartScreen;
        pcVar3 = userinfo_t::GetName((userinfo_t *)((ulong)doomcom.data[1] * 0x2a0 + 0xd63498));
        (*pFVar1->_vptr_FStartupScreen[7])
                  (pFVar1,"Found %s (node %d, player %d)",pcVar3,(ulong)local_44,
                   (ulong)(doomcom.data[1] + 1));
      }
      goto LAB_00599a74;
    }
    if (doomcom.data[0] == '\"') {
      s[0x20] = -0x80;
      doomcom.ticdup = (SWORD)doomcom.data[1];
      ticdup = (int)doomcom.ticdup;
      NetMode = doomcom.data[2];
      _node = doomcom.data + 3;
      stream = (BYTE *)ReadString((BYTE **)&node);
      FString::operator=(&startmap,(char *)stream);
      if (stream != (BYTE *)0x0) {
        operator_delete__(stream);
      }
      rngseed = ReadLong((BYTE **)&node);
      C_ReadCVars((BYTE **)&node);
      goto LAB_00599a74;
    }
    if (doomcom.data[0] != '#') goto LAB_00599a74;
  }
  else {
    if (consoleplayer != Net_Arbitrator) goto LAB_00599db4;
    local_3c = 0;
    while (((local_3c < doomcom.numnodes &&
            (*(int *)(s + (long)local_3c * 4) == (1 << ((byte)doomcom.numnodes & 0x1f)) + -1)) &&
           (s[(long)local_3c + 0x20] != '\0'))) {
      local_3c = local_3c + 1;
    }
    if (local_3c != doomcom.numnodes) {
LAB_00599db4:
      doomcom.data[2] = 0xff;
      doomcom.data[3] = '\0';
      doomcom.data[4] = 0xe8;
      doomcom.data[5] = (BYTE)((uint)*(undefined4 *)s >> 0x18);
      doomcom.data[6] = (BYTE)((uint)*(undefined4 *)s >> 0x10);
      doomcom.data[7] = (BYTE)((uint)*(undefined4 *)s >> 8);
      doomcom.data[8] = (BYTE)*(undefined4 *)s;
      if (consoleplayer == Net_Arbitrator) {
        doomcom.data[0] = '!';
        for (local_3c = 1; local_3c < doomcom.numnodes; local_3c = local_3c + 1) {
          for (local_40 = 0; local_40 < doomcom.numnodes; local_40 = local_40 + 1) {
            bVar4 = (byte)local_40;
            if (((*(uint *)s & 1 << (bVar4 & 0x1f)) != 0) &&
               ((*(uint *)(s + (long)local_3c * 4) & 1 << (bVar4 & 0x1f)) == 0)) {
              _node = doomcom.data + 9;
              doomcom.data[1] = bVar4;
              D_WriteUserInfoStrings(local_40,(BYTE **)&node,true);
              HSendPacket(local_3c,(int)_node + -0xd54f74);
            }
          }
        }
      }
      else {
        doomcom.data[0] = ' ';
        doomcom.data[1] = (BYTE)consoleplayer;
        doomcom.data[9] = s[0x20];
        _node = doomcom.data + 10;
        D_WriteUserInfoStrings(consoleplayer,(BYTE **)&node,true);
        SendSetup((DWORD *)s,(BYTE *)(s + 0x20),(int)_node + -0xd54f74);
      }
      if (consoleplayer == Net_Arbitrator) {
        doomcom.data[0] = '\"';
        doomcom.data[1] = (BYTE)doomcom.ticdup;
        doomcom.data[2] = NetMode;
        _node = doomcom.data + 3;
        pcVar3 = FString::operator_cast_to_char_(&startmap);
        WriteString(pcVar3,(BYTE **)&node);
        WriteLong(rngseed,(BYTE **)&node);
        C_WriteCVars((BYTE **)&node,4,true);
        SendSetup((DWORD *)s,(BYTE *)(s + 0x20),(int)_node + -0xd54f74);
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool DoArbitrate (void *userdata)
{
	ArbitrateData *data = (ArbitrateData *)userdata;
	char *s;
	BYTE *stream;
	int version;
	int node;
	int i, j;

	while (HGetPacket ())
	{
		if (netbuffer[0] == NCMD_EXIT)
		{
			I_FatalError ("The game was aborted.");
		}

		if (doomcom.remotenode == 0)
		{
			continue;
		}

		if (netbuffer[0] == NCMD_SETUP || netbuffer[0] == NCMD_SETUP+1)		// got user info
		{
			node = (netbuffer[0] == NCMD_SETUP) ? doomcom.remotenode : nodeforplayer[netbuffer[1]];

			data->playersdetected[node] =
				(netbuffer[5] << 24) | (netbuffer[6] << 16) | (netbuffer[7] << 8) | netbuffer[8];

			if (netbuffer[0] == NCMD_SETUP)
			{ // Sent to host
				data->gotsetup[node] = netbuffer[9] & 0x80;
				stream = &netbuffer[10];
			}
			else
			{ // Sent from host
				stream = &netbuffer[9];
			}

			D_ReadUserInfoStrings (netbuffer[1], &stream, false);
			if (!nodeingame[node])
			{
				version = (netbuffer[2] << 16) | (netbuffer[3] << 8) | netbuffer[4];
				if (version != (0xFF0000 | NETGAMEVERSION))
				{
					I_Error ("Different " GAMENAME " versions cannot play a net game");
				}

				playeringame[netbuffer[1]] = true;
				nodeingame[node] = true;

				data->playersdetected[0] |= 1 << netbuffer[1];

				StartScreen->NetMessage ("Found %s (node %d, player %d)",
						players[netbuffer[1]].userinfo.GetName(),
						node, netbuffer[1]+1);
			}
		}
		else if (netbuffer[0] == NCMD_SETUP+2)	// got game info
		{
			data->gotsetup[0] = 0x80;

			ticdup = doomcom.ticdup = netbuffer[1];
			NetMode = netbuffer[2];

			stream = &netbuffer[3];
			s = ReadString (&stream);
			startmap = s;
			delete[] s;
			rngseed = ReadLong (&stream);
			C_ReadCVars (&stream);
		}
		else if (netbuffer[0] == NCMD_SETUP+3)
		{
			return true;
		}
	}

	// If everybody already knows everything, it's time to go
	if (consoleplayer == Net_Arbitrator)
	{
		for (i = 0; i < doomcom.numnodes; ++i)
			if (data->playersdetected[i] != DWORD(1 << doomcom.numnodes) - 1 || !data->gotsetup[i])
				break;

		if (i == doomcom.numnodes)
			return true;
	}

	netbuffer[2] = 255;
	netbuffer[3] = (NETGAMEVERSION >> 8) & 255;
	netbuffer[4] = NETGAMEVERSION & 255;
	netbuffer[5] = data->playersdetected[0] >> 24;
	netbuffer[6] = data->playersdetected[0] >> 16;
	netbuffer[7] = data->playersdetected[0] >> 8;
	netbuffer[8] = data->playersdetected[0];

	if (consoleplayer != Net_Arbitrator)
	{ // Send user info for the local node
		netbuffer[0] = NCMD_SETUP;
		netbuffer[1] = consoleplayer;
		netbuffer[9] = data->gotsetup[0];
		stream = &netbuffer[10];
		D_WriteUserInfoStrings (consoleplayer, &stream, true);
		SendSetup (data->playersdetected, data->gotsetup, int(stream - netbuffer));
	}
	else
	{ // Send user info for all nodes
		netbuffer[0] = NCMD_SETUP+1;
		for (i = 1; i < doomcom.numnodes; ++i)
		{
			for (j = 0; j < doomcom.numnodes; ++j)
			{
				// Send info about player j to player i?
				if ((data->playersdetected[0] & (1<<j)) && !(data->playersdetected[i] & (1<<j)))
				{
					netbuffer[1] = j;
					stream = &netbuffer[9];
					D_WriteUserInfoStrings (j, &stream, true);
					HSendPacket (i, int(stream - netbuffer));
				}
			}
		}
	}

	// If we're the host, send the game info, too
	if (consoleplayer == Net_Arbitrator)
	{
		netbuffer[0] = NCMD_SETUP+2;
		netbuffer[1] = (BYTE)doomcom.ticdup;
		netbuffer[2] = NetMode;
		stream = &netbuffer[3];
		WriteString (startmap, &stream);
		WriteLong (rngseed, &stream);
		C_WriteCVars (&stream, CVAR_SERVERINFO, true);

		SendSetup (data->playersdetected, data->gotsetup, int(stream - netbuffer));
	}
	return false;
}